

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkReplaceAdaptController(ARKodeMem ark_mem,SUNAdaptController C,int take_ownership)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  char *msgfmt;
  long leniw;
  long lenrw;
  
  pAVar2 = ark_mem->hadapt_mem;
  if ((pAVar2->owncontroller == 0) || (pAVar2->hcontroller == (SUNAdaptController)0x0)) {
LAB_0013b074:
    pAVar2->hcontroller = (SUNAdaptController)0x0;
    if (C == (SUNAdaptController)0x0) {
      C = SUNAdaptController_I(ark_mem->sunctx);
      if (C == (SUNAdaptController)0x0) {
        msgfmt = "SUNAdaptController_I allocation failure";
        iVar1 = 0xd0d;
        goto LAB_0013b0f7;
      }
      pAVar2 = ark_mem->hadapt_mem;
      take_ownership = 1;
    }
    pAVar2->owncontroller = take_ownership;
    iVar1 = SUNAdaptController_Space(C,&lenrw,&leniw);
    if (iVar1 == 0) {
      ark_mem->liw = ark_mem->liw + leniw;
      ark_mem->lrw = ark_mem->lrw + lenrw;
    }
    ark_mem->hadapt_mem->hcontroller = C;
    iVar3 = 0;
  }
  else {
    iVar1 = SUNAdaptController_Space(pAVar2->hcontroller,&lenrw,&leniw);
    if (iVar1 == 0) {
      ark_mem->liw = ark_mem->liw - leniw;
      ark_mem->lrw = ark_mem->lrw - lenrw;
    }
    iVar1 = SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
    pAVar2 = ark_mem->hadapt_mem;
    pAVar2->owncontroller = 0;
    if (iVar1 == 0) goto LAB_0013b074;
    msgfmt = "SUNAdaptController_Destroy failure";
    iVar1 = 0xd00;
LAB_0013b0f7:
    iVar3 = -0x14;
    arkProcessError(ark_mem,-0x14,iVar1,"arkReplaceAdaptController",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
  }
  return iVar3;
}

Assistant:

int arkReplaceAdaptController(ARKodeMem ark_mem, SUNAdaptController C,
                              sunbooleantype take_ownership)
{
  int retval;
  long int lenrw, leniw;

  /* Remove current SUNAdaptController object
     (delete if owned, and then nullify pointer) */
  if (ark_mem->hadapt_mem->owncontroller &&
      (ark_mem->hadapt_mem->hcontroller != NULL))
  {
    retval = SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                      &leniw);
    if (retval == SUN_SUCCESS)
    {
      ark_mem->liw -= leniw;
      ark_mem->lrw -= lenrw;
    }

    retval = SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->hadapt_mem->hcontroller = NULL;

  /* On NULL-valued input, create default SUNAdaptController object */
  if (C == NULL)
  {
    C = SUNAdaptController_I(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_I allocation failure");
      return (ARK_MEM_FAIL);
    }
    ark_mem->hadapt_mem->owncontroller = SUNTRUE;
  }
  else { ark_mem->hadapt_mem->owncontroller = take_ownership; }

  /* Attach new SUNAdaptController object */
  retval = SUNAdaptController_Space(C, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw += leniw;
    ark_mem->lrw += lenrw;
  }
  ark_mem->hadapt_mem->hcontroller = C;

  return (ARK_SUCCESS);
}